

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d00101::BIP32PubkeyProvider::ToPrivateString
          (BIP32PubkeyProvider *this,SigningProvider *arg,string *out)

{
  long lVar1;
  bool bVar2;
  BIP32PubkeyProvider *in_RDX;
  CExtKey *in_RDI;
  long in_FS_OFFSET;
  CExtKey key;
  BIP32PubkeyProvider *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  char in_stack_ffffffffffffff07;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  CExtKey *key_00;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_00 = in_RDI;
  CExtKey::CExtKey((CExtKey *)in_stack_fffffffffffffef8);
  bVar2 = GetExtKey(in_RDX,(SigningProvider *)
                           CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                    (CExtKey *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (bVar2) {
    EncodeExtKey_abi_cxx11_(key_00);
    FormatHDKeypath_abi_cxx11_
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDX,
               (bool)in_stack_ffffffffffffff37);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffef8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffef8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffef8);
    bVar2 = IsRange(in_stack_fffffffffffffef8);
    if ((bVar2) &&
       (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (char *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00)),
       *(int *)(in_RDI[2].chaincode.super_base_blob<256U>.m_data._M_elems + 0xc) == 2)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff07);
    }
    bVar3 = 1;
  }
  else {
    bVar3 = 0;
  }
  CExtKey::~CExtKey((CExtKey *)in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ToPrivateString(const SigningProvider& arg, std::string& out) const override
    {
        CExtKey key;
        if (!GetExtKey(arg, key)) return false;
        out = EncodeExtKey(key) + FormatHDKeypath(m_path, /*apostrophe=*/m_apostrophe);
        if (IsRange()) {
            out += "/*";
            if (m_derive == DeriveType::HARDENED) out += m_apostrophe ? '\'' : 'h';
        }
        return true;
    }